

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cali.cpp
# Opt level: O1

void cali_begin_byname(char *attr_name)

{
  Attribute attr;
  Caliper c;
  allocator<char> local_61;
  Attribute local_60;
  string local_58;
  Caliper local_38;
  
  cali::Caliper::Caliper(&local_38);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,attr_name,&local_61);
  local_60 = cali::Caliper::create_attribute
                       (&local_38,&local_58,CALI_TYPE_BOOL,0,0,(Attribute *)0x0,(Variant *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_58._M_dataplus._M_p = (pointer)0x7;
  local_58._M_string_length = 1;
  cali::Caliper::begin(&local_38,&local_60,(Variant *)&local_58);
  return;
}

Assistant:

void cali_begin_byname(const char* attr_name)
{
    Caliper   c;
    Attribute attr = c.create_attribute(attr_name, CALI_TYPE_BOOL, CALI_ATTR_DEFAULT);

    c.begin(attr, Variant(true));
}